

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

Constant *
spvtools::opt::anon_unknown_0::FoldClamp1
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<const_spvtools::opt::analysis::Constant_*> __l;
  initializer_list<const_spvtools::opt::analysis::Constant_*> __l_00;
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  FeatureManager *this;
  const_reference ppCVar4;
  Constant *pCVar5;
  allocator<const_spvtools::opt::analysis::Constant_*> local_f1;
  Constant *local_f0;
  value_type local_e8;
  iterator local_e0;
  size_type local_d8;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_d0;
  BinaryScalarFoldingRule local_b8;
  allocator<const_spvtools::opt::analysis::Constant_*> local_91;
  value_type local_90;
  value_type local_88;
  iterator local_80;
  size_type local_78;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_70;
  BinaryScalarFoldingRule local_58;
  Constant *local_38;
  Constant *temp;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *pvStack_28;
  uint32_t i;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  
  pvStack_28 = constants;
  constants_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)context;
  OVar1 = opt::Instruction::opcode(inst);
  if (OVar1 != OpExtInst) {
    __assert_fail("inst->opcode() == spv::Op::OpExtInst && \"Expecting an extended instruction.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x5ec,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp1(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar2 = opt::Instruction::GetSingleWordInOperand((Instruction *)constants_local,0);
  this = IRContext::get_feature_mgr((IRContext *)inst_local);
  uVar3 = FeatureManager::GetExtInstImportId_GLSLstd450(this);
  if (uVar2 == uVar3) {
    temp._4_4_ = 1;
    while( true ) {
      if (3 < temp._4_4_) {
        std::
        function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
        ::
        function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
                  ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                    *)&local_58,FoldMax);
        uVar2 = opt::Instruction::type_id((Instruction *)constants_local);
        ppCVar4 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](pvStack_28,1);
        local_90 = *ppCVar4;
        ppCVar4 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](pvStack_28,2);
        local_88 = *ppCVar4;
        local_80 = &local_90;
        local_78 = 2;
        std::allocator<const_spvtools::opt::analysis::Constant_*>::allocator(&local_91);
        __l_00._M_len = local_78;
        __l_00._M_array = local_80;
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::vector(&local_70,__l_00,&local_91);
        pCVar5 = FoldFPBinaryOp(&local_58,uVar2,&local_70,(IRContext *)inst_local);
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::~vector(&local_70);
        std::allocator<const_spvtools::opt::analysis::Constant_*>::~allocator(&local_91);
        std::
        function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
        ::~function(&local_58);
        if (pCVar5 == (Constant *)0x0) {
          context_local = (IRContext *)0x0;
        }
        else {
          local_38 = pCVar5;
          std::
          function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
          ::
          function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
                    ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                      *)&local_b8,FoldMin);
          uVar2 = opt::Instruction::type_id((Instruction *)constants_local);
          local_f0 = local_38;
          ppCVar4 = std::
                    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ::operator[](pvStack_28,3);
          local_e8 = *ppCVar4;
          local_e0 = &local_f0;
          local_d8 = 2;
          std::allocator<const_spvtools::opt::analysis::Constant_*>::allocator(&local_f1);
          __l._M_len = local_d8;
          __l._M_array = local_e0;
          std::
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ::vector(&local_d0,__l,&local_f1);
          context_local =
               (IRContext *)FoldFPBinaryOp(&local_b8,uVar2,&local_d0,(IRContext *)inst_local);
          std::
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ::~vector(&local_d0);
          std::allocator<const_spvtools::opt::analysis::Constant_*>::~allocator(&local_f1);
          std::
          function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
          ::~function(&local_b8);
        }
        return (Constant *)context_local;
      }
      ppCVar4 = std::
                vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ::operator[](pvStack_28,(ulong)temp._4_4_);
      if (*ppCVar4 == (value_type)0x0) break;
      temp._4_4_ = temp._4_4_ + 1;
    }
    return (Constant *)0x0;
  }
  __assert_fail("inst->GetSingleWordInOperand(0) == context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() && \"Expecting a GLSLstd450 extended instruction.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                ,0x5ef,
                "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp1(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

const analysis::Constant* FoldClamp1(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpExtInst &&
         "Expecting an extended instruction.");
  assert(inst->GetSingleWordInOperand(0) ==
             context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
         "Expecting a GLSLstd450 extended instruction.");

  // Make sure all Clamp operands are constants.
  for (uint32_t i = 1; i < 4; i++) {
    if (constants[i] == nullptr) {
      return nullptr;
    }
  }

  const analysis::Constant* temp = FoldFPBinaryOp(
      FoldMax, inst->type_id(), {constants[1], constants[2]}, context);
  if (temp == nullptr) {
    return nullptr;
  }
  return FoldFPBinaryOp(FoldMin, inst->type_id(), {temp, constants[3]},
                        context);
}